

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test6::iterate(GPUShaderFP64Test6 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  _test_case *local_35b0;
  _test_case *test_case;
  uint n_test_case;
  uint n_test_cases;
  allocator<char> local_2448;
  allocator<char> local_2447;
  allocator<char> local_2446;
  allocator<char> local_2445;
  allocator<char> local_2444;
  undefined1 local_2443;
  undefined1 local_2442;
  undefined1 local_2441;
  undefined1 local_2440;
  undefined1 local_243f;
  allocator<char> local_243e;
  allocator<char> local_243d;
  allocator<char> local_243c;
  allocator<char> local_243b;
  allocator<char> local_243a;
  allocator<char> local_2439;
  undefined1 local_2438;
  undefined1 local_2437;
  undefined1 local_2436;
  undefined1 local_2435;
  undefined1 local_2434;
  allocator<char> local_2433;
  allocator<char> local_2432;
  allocator<char> local_2431;
  allocator<char> local_2430;
  allocator<char> local_242f;
  allocator<char> local_242e;
  undefined1 local_242d;
  undefined1 local_242c;
  undefined1 local_242b;
  undefined1 local_242a;
  undefined1 local_2429;
  allocator<char> local_2428;
  allocator<char> local_2427;
  allocator<char> local_2426;
  allocator<char> local_2425;
  allocator<char> local_2424;
  allocator<char> local_2423;
  undefined1 local_2422;
  undefined1 local_2421;
  undefined1 local_2420;
  undefined1 local_241f;
  undefined1 local_241e;
  allocator<char> local_241d;
  allocator<char> local_241c;
  allocator<char> local_241b;
  allocator<char> local_241a;
  allocator<char> local_2419;
  allocator<char> local_2418;
  undefined1 local_2417;
  undefined1 local_2416;
  undefined1 local_2415;
  undefined1 local_2414;
  undefined1 local_2413;
  allocator<char> local_2412;
  allocator<char> local_2411;
  allocator<char> local_2410;
  allocator<char> local_240f;
  allocator<char> local_240e;
  allocator<char> local_240d;
  undefined1 local_240c;
  undefined1 local_240b;
  undefined1 local_240a;
  undefined1 local_2409;
  undefined1 local_2408;
  allocator<char> local_2407;
  allocator<char> local_2406;
  allocator<char> local_2405;
  allocator<char> local_2404;
  allocator<char> local_2403;
  allocator<char> local_2402;
  undefined1 local_2401;
  undefined1 local_2400;
  undefined1 local_23ff;
  undefined1 local_23fe;
  undefined1 local_23fd;
  allocator<char> local_23fc;
  allocator<char> local_23fb;
  allocator<char> local_23fa;
  allocator<char> local_23f9;
  allocator<char> local_23f8;
  allocator<char> local_23f7;
  undefined1 local_23f6;
  undefined1 local_23f5;
  undefined1 local_23f4;
  undefined1 local_23f3;
  undefined1 local_23f2;
  allocator<char> local_23f1;
  allocator<char> local_23f0;
  allocator<char> local_23ef;
  allocator<char> local_23ee;
  allocator<char> local_23ed;
  allocator<char> local_23ec;
  undefined1 local_23eb;
  undefined1 local_23ea;
  undefined1 local_23e9;
  undefined1 local_23e8;
  undefined1 local_23e7;
  allocator<char> local_23e6;
  allocator<char> local_23e5;
  allocator<char> local_23e4;
  allocator<char> local_23e3;
  allocator<char> local_23e2;
  allocator<char> local_23e1;
  undefined1 local_23e0;
  undefined1 local_23df;
  undefined1 local_23de;
  undefined1 local_23dd;
  undefined1 local_23dc;
  allocator<char> local_23db;
  allocator<char> local_23da;
  allocator<char> local_23d9;
  allocator<char> local_23d8;
  allocator<char> local_23d7;
  allocator<char> local_23d6;
  undefined1 local_23d5;
  undefined1 local_23d4;
  undefined1 local_23d3;
  undefined1 local_23d2;
  undefined1 local_23d1;
  allocator<char> local_23d0;
  allocator<char> local_23cf;
  allocator<char> local_23ce;
  allocator<char> local_23cd;
  allocator<char> local_23cc;
  allocator<char> local_23cb;
  undefined1 local_23ca;
  undefined1 local_23c9;
  undefined1 local_23c8;
  undefined1 local_23c7;
  undefined1 local_23c6;
  allocator<char> local_23c5;
  allocator<char> local_23c4;
  allocator<char> local_23c3;
  allocator<char> local_23c2;
  allocator<char> local_23c1;
  allocator<char> local_23c0;
  undefined1 local_23bf;
  undefined1 local_23be;
  undefined1 local_23bd;
  undefined1 local_23bc;
  undefined1 local_23bb;
  allocator<char> local_23ba;
  allocator<char> local_23b9;
  allocator<char> local_23b8;
  allocator<char> local_23b7;
  allocator<char> local_23b6;
  allocator<char> local_23b5;
  undefined1 local_23b4;
  undefined1 local_23b3;
  undefined1 local_23b2;
  undefined1 local_23b1;
  undefined1 local_23b0;
  allocator<char> local_23af;
  allocator<char> local_23ae;
  allocator<char> local_23ad;
  allocator<char> local_23ac;
  allocator<char> local_23ab;
  allocator<char> local_23aa;
  undefined1 local_23a9;
  undefined1 local_23a8;
  undefined1 local_23a7;
  undefined1 local_23a6;
  undefined1 local_23a5;
  allocator<char> local_23a4;
  allocator<char> local_23a3;
  allocator<char> local_23a2;
  allocator<char> local_23a1;
  allocator<char> local_23a0;
  allocator<char> local_239f;
  undefined1 local_239e;
  undefined1 local_239d;
  undefined1 local_239c;
  undefined1 local_239b;
  undefined1 local_239a;
  allocator<char> local_2399;
  allocator<char> local_2398;
  allocator<char> local_2397;
  allocator<char> local_2396;
  allocator<char> local_2395;
  allocator<char> local_2394;
  undefined1 local_2393;
  undefined1 local_2392;
  undefined1 local_2391;
  undefined1 local_2390;
  undefined1 local_238f;
  allocator<char> local_238e;
  allocator<char> local_238d;
  allocator<char> local_238c;
  allocator<char> local_238b;
  allocator<char> local_238a;
  allocator<char> local_2389;
  undefined1 local_2388;
  undefined1 local_2387;
  undefined1 local_2386;
  undefined1 local_2385;
  undefined1 local_2384;
  allocator<char> local_2383;
  allocator<char> local_2382;
  allocator<char> local_2381;
  allocator<char> local_2380;
  allocator<char> local_237f;
  allocator<char> local_237e;
  undefined1 local_237d;
  undefined1 local_237c;
  undefined1 local_237b;
  undefined1 local_237a;
  undefined1 local_2379;
  allocator<char> local_2378;
  allocator<char> local_2377;
  allocator<char> local_2376;
  allocator<char> local_2375;
  allocator<char> local_2374;
  allocator<char> local_2373;
  undefined1 local_2372;
  undefined1 local_2371;
  undefined1 local_2370;
  undefined1 local_236f;
  undefined1 local_236e;
  allocator<char> local_236d;
  allocator<char> local_236c;
  allocator<char> local_236b;
  allocator<char> local_236a;
  allocator<char> local_2369;
  allocator<char> local_2368;
  undefined1 local_2367;
  undefined1 local_2366;
  undefined1 local_2365;
  undefined1 local_2364;
  undefined1 local_2363;
  allocator<char> local_2362;
  allocator<char> local_2361;
  allocator<char> local_2360;
  allocator<char> local_235f;
  allocator<char> local_235e;
  allocator<char> local_235d;
  undefined1 local_235c;
  undefined1 local_235b;
  undefined1 local_235a;
  undefined1 local_2359;
  undefined1 local_2358;
  allocator<char> local_2357;
  allocator<char> local_2356;
  allocator<char> local_2355;
  allocator<char> local_2354;
  allocator<char> local_2353;
  allocator<char> local_2352;
  undefined1 local_2351;
  undefined1 local_2350;
  undefined1 local_234f;
  undefined1 local_234e;
  undefined1 local_234d;
  allocator<char> local_234c;
  allocator<char> local_234b;
  allocator<char> local_234a;
  allocator<char> local_2349;
  allocator<char> local_2348;
  allocator<char> local_2347;
  undefined1 local_2346;
  undefined1 local_2345;
  undefined1 local_2344;
  undefined1 local_2343;
  undefined1 local_2342;
  allocator<char> local_2341;
  allocator<char> local_2340;
  allocator<char> local_233f;
  allocator<char> local_233e;
  allocator<char> local_233d;
  allocator<char> local_233c;
  undefined1 local_233b;
  undefined1 local_233a;
  undefined1 local_2339;
  undefined1 local_2338;
  undefined1 local_2337;
  allocator<char> local_2336;
  allocator<char> local_2335;
  allocator<char> local_2334;
  allocator<char> local_2333;
  allocator<char> local_2332;
  allocator<char> local_2331;
  undefined1 local_2330;
  undefined1 local_232f;
  undefined1 local_232e;
  undefined1 local_232d;
  undefined1 local_232c;
  allocator<char> local_232b;
  allocator<char> local_232a;
  allocator<char> local_2329;
  allocator<char> local_2328;
  allocator<char> local_2327;
  allocator<char> local_2326;
  undefined1 local_2325;
  undefined1 local_2324;
  undefined1 local_2323;
  undefined1 local_2322;
  undefined1 local_2321;
  allocator<char> local_2320;
  allocator<char> local_231f;
  allocator<char> local_231e;
  allocator<char> local_231d;
  allocator<char> local_231c;
  allocator<char> local_231b;
  undefined1 local_231a;
  undefined1 local_2319;
  undefined1 local_2318;
  undefined1 local_2317;
  undefined1 local_2316;
  allocator<char> local_2315;
  allocator<char> local_2314;
  allocator<char> local_2313;
  allocator<char> local_2312;
  allocator<char> local_2311;
  allocator<char> local_2310;
  undefined1 local_230f;
  undefined1 local_230e;
  undefined1 local_230d;
  undefined1 local_230c;
  undefined1 local_230b;
  allocator<char> local_230a;
  allocator<char> local_2309;
  allocator<char> local_2308;
  allocator<char> local_2307;
  allocator<char> local_2306;
  allocator<char> local_2305;
  undefined1 local_2304;
  undefined1 local_2303;
  undefined1 local_2302;
  undefined1 local_2301;
  undefined1 local_2300;
  allocator<char> local_22ff;
  allocator<char> local_22fe;
  allocator<char> local_22fd;
  allocator<char> local_22fc;
  allocator<char> local_22fb;
  allocator<char> local_22fa;
  undefined1 local_22f9;
  undefined1 local_22f8;
  undefined1 local_22f7;
  undefined1 local_22f6;
  undefined1 local_22f5;
  allocator<char> local_22f4;
  allocator<char> local_22f3;
  allocator<char> local_22f2;
  allocator<char> local_22f1;
  allocator<char> local_22f0;
  allocator<char> local_22ef;
  undefined1 local_22ee;
  undefined1 local_22ed;
  undefined1 local_22ec;
  undefined1 local_22eb;
  undefined1 local_22ea;
  allocator<char> local_22e9;
  allocator<char> local_22e8;
  allocator<char> local_22e7;
  allocator<char> local_22e6;
  allocator<char> local_22e5;
  allocator<char> local_22e4;
  undefined1 local_22e3;
  undefined1 local_22e2;
  undefined1 local_22e1;
  undefined1 local_22e0;
  undefined1 local_22df;
  allocator<char> local_22de;
  allocator<char> local_22dd;
  allocator<char> local_22dc;
  allocator<char> local_22db;
  allocator<char> local_22da;
  allocator<char> local_22d9;
  undefined1 local_22d8;
  undefined1 local_22d7;
  undefined1 local_22d6;
  undefined1 local_22d5;
  undefined1 local_22d4;
  allocator<char> local_22d3;
  allocator<char> local_22d2;
  allocator<char> local_22d1;
  allocator<char> local_22d0;
  allocator<char> local_22cf;
  allocator<char> local_22ce;
  undefined1 local_22cd;
  undefined1 local_22cc;
  undefined1 local_22cb;
  undefined1 local_22ca;
  undefined1 local_22c9;
  allocator<char> local_22c8;
  allocator<char> local_22c7;
  allocator<char> local_22c6;
  allocator<char> local_22c5;
  allocator<char> local_22c4;
  allocator<char> local_22c3;
  undefined1 local_22c2;
  undefined1 local_22c1;
  undefined1 local_22c0;
  undefined1 local_22bf;
  undefined1 local_22be;
  allocator<char> local_22bd;
  allocator<char> local_22bc;
  allocator<char> local_22bb;
  allocator<char> local_22ba;
  allocator<char> local_22b9;
  allocator<char> local_22b8;
  undefined1 local_22b7;
  undefined1 local_22b6;
  undefined1 local_22b5;
  undefined1 local_22b4;
  undefined1 local_22b3;
  allocator<char> local_22b2;
  allocator<char> local_22b1;
  allocator<char> local_22b0;
  allocator<char> local_22af;
  allocator<char> local_22ae;
  allocator<char> local_22ad;
  undefined1 local_22ac;
  undefined1 local_22ab;
  undefined1 local_22aa;
  undefined1 local_22a9;
  undefined1 local_22a8;
  allocator<char> local_22a7;
  allocator<char> local_22a6;
  allocator<char> local_22a5;
  allocator<char> local_22a4;
  allocator<char> local_22a3;
  allocator<char> local_22a2;
  undefined1 local_22a1;
  undefined1 local_22a0;
  undefined1 local_229f;
  undefined1 local_229e;
  undefined1 local_229d;
  allocator<char> local_229c;
  allocator<char> local_229b;
  allocator<char> local_229a;
  allocator<char> local_2299;
  allocator<char> local_2298;
  allocator<char> local_2297;
  undefined1 local_2296;
  undefined1 local_2295;
  undefined1 local_2294;
  undefined1 local_2293;
  undefined1 local_2292;
  allocator<char> local_2291;
  allocator<char> local_2290;
  allocator<char> local_228f;
  allocator<char> local_228e;
  allocator<char> local_228d;
  allocator<char> local_228c;
  undefined1 local_228b;
  undefined1 local_228a;
  undefined1 local_2289;
  undefined1 local_2288;
  undefined1 local_2287;
  allocator<char> local_2286;
  allocator<char> local_2285;
  allocator<char> local_2284;
  allocator<char> local_2283;
  allocator<char> local_2282;
  allocator<char> local_2281;
  undefined1 *local_2280;
  undefined1 local_2278 [8];
  _test_case test_cases [42];
  string local_38;
  GPUShaderFP64Test6 *local_18;
  GPUShaderFP64Test6 *this_local;
  
  local_18 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_gpu_shader_fp64 is not supported.",
               (allocator<char> *)&stack0xffffffffffffffc7);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  local_2280 = local_2278;
  local_2278._0_4_ = 2;
  local_2278._4_4_ = VARIABLE_TYPE_INT;
  test_cases[0].src_array_size = 4;
  test_cases[0].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0].dst_type,"",&local_2281);
  local_228b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0].cs_shader_body.field_2._M_local_buf + 8),"",&local_2282);
  local_228a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0].fs_shader_body.field_2._M_local_buf + 8),"",&local_2283);
  local_2289 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0].gs_shader_body.field_2._M_local_buf + 8),"",&local_2284);
  local_2288 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0].tc_shader_body.field_2._M_local_buf + 8),"",&local_2285);
  local_2287 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0].te_shader_body.field_2._M_local_buf + 8),"",&local_2286);
  local_2287 = 0;
  local_2288 = 0;
  local_2289 = 0;
  local_228a = 0;
  local_228b = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0].vs_shader_body.field_2 + 8);
  test_cases[0].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0].vs_shader_body.field_2._12_4_ = 0x12;
  test_cases[1].src_array_size = 4;
  test_cases[1].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[1].dst_type,"",&local_228c);
  local_2296 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[1].cs_shader_body.field_2._M_local_buf + 8),"",&local_228d);
  local_2295 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[1].fs_shader_body.field_2._M_local_buf + 8),"",&local_228e);
  local_2294 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[1].gs_shader_body.field_2._M_local_buf + 8),"",&local_228f);
  local_2293 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[1].tc_shader_body.field_2._M_local_buf + 8),"",&local_2290);
  local_2292 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[1].te_shader_body.field_2._M_local_buf + 8),"",&local_2291);
  local_2292 = 0;
  local_2293 = 0;
  local_2294 = 0;
  local_2295 = 0;
  local_2296 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[1].vs_shader_body.field_2 + 8);
  test_cases[1].vs_shader_body.field_2._8_4_ = 2;
  test_cases[1].vs_shader_body.field_2._12_4_ = 0x13;
  test_cases[2].src_array_size = 0xe;
  test_cases[2].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[2].dst_type,"",&local_2297);
  local_22a1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[2].cs_shader_body.field_2._M_local_buf + 8),"",&local_2298);
  local_22a0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[2].fs_shader_body.field_2._M_local_buf + 8),"",&local_2299);
  local_229f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[2].gs_shader_body.field_2._M_local_buf + 8),"",&local_229a);
  local_229e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[2].tc_shader_body.field_2._M_local_buf + 8),"",&local_229b);
  local_229d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[2].te_shader_body.field_2._M_local_buf + 8),"",&local_229c);
  local_229d = 0;
  local_229e = 0;
  local_229f = 0;
  local_22a0 = 0;
  local_22a1 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[2].vs_shader_body.field_2 + 8);
  test_cases[2].vs_shader_body.field_2._8_4_ = 2;
  test_cases[2].vs_shader_body.field_2._12_4_ = 0x13;
  test_cases[3].src_array_size = 0xe;
  test_cases[3].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[3].dst_type,"",&local_22a2);
  local_22ac = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[3].cs_shader_body.field_2._M_local_buf + 8),"",&local_22a3);
  local_22ab = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[3].fs_shader_body.field_2._M_local_buf + 8),"",&local_22a4);
  local_22aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[3].gs_shader_body.field_2._M_local_buf + 8),"",&local_22a5);
  local_22a9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[3].tc_shader_body.field_2._M_local_buf + 8),"",&local_22a6);
  local_22a8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[3].te_shader_body.field_2._M_local_buf + 8),"",&local_22a7);
  local_22a8 = 0;
  local_22a9 = 0;
  local_22aa = 0;
  local_22ab = 0;
  local_22ac = 0;
  local_2280 = (undefined1 *)((long)&test_cases[3].vs_shader_body.field_2 + 8);
  test_cases[3].vs_shader_body.field_2._8_4_ = 2;
  test_cases[3].vs_shader_body.field_2._12_4_ = 0x14;
  test_cases[4].src_array_size = 0xf;
  test_cases[4].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[4].dst_type,"",&local_22ad);
  local_22b7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[4].cs_shader_body.field_2._M_local_buf + 8),"",&local_22ae);
  local_22b6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[4].fs_shader_body.field_2._M_local_buf + 8),"",&local_22af);
  local_22b5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[4].gs_shader_body.field_2._M_local_buf + 8),"",&local_22b0);
  local_22b4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[4].tc_shader_body.field_2._M_local_buf + 8),"",&local_22b1);
  local_22b3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[4].te_shader_body.field_2._M_local_buf + 8),"",&local_22b2);
  local_22b3 = 0;
  local_22b4 = 0;
  local_22b5 = 0;
  local_22b6 = 0;
  local_22b7 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[4].vs_shader_body.field_2 + 8);
  test_cases[4].vs_shader_body.field_2._8_4_ = 2;
  test_cases[4].vs_shader_body.field_2._12_4_ = 0x14;
  test_cases[5].src_array_size = 0xf;
  test_cases[5].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[5].dst_type,"",&local_22b8);
  local_22c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[5].cs_shader_body.field_2._M_local_buf + 8),"",&local_22b9);
  local_22c1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[5].fs_shader_body.field_2._M_local_buf + 8),"",&local_22ba);
  local_22c0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[5].gs_shader_body.field_2._M_local_buf + 8),"",&local_22bb);
  local_22bf = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[5].tc_shader_body.field_2._M_local_buf + 8),"",&local_22bc);
  local_22be = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[5].te_shader_body.field_2._M_local_buf + 8),"",&local_22bd);
  local_22be = 0;
  local_22bf = 0;
  local_22c0 = 0;
  local_22c1 = 0;
  local_22c2 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[5].vs_shader_body.field_2 + 8);
  test_cases[5].vs_shader_body.field_2._8_4_ = 2;
  test_cases[5].vs_shader_body.field_2._12_4_ = 0x15;
  test_cases[6].src_array_size = 0x10;
  test_cases[6].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[6].dst_type,"",&local_22c3);
  local_22cd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[6].cs_shader_body.field_2._M_local_buf + 8),"",&local_22c4);
  local_22cc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[6].fs_shader_body.field_2._M_local_buf + 8),"",&local_22c5);
  local_22cb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[6].gs_shader_body.field_2._M_local_buf + 8),"",&local_22c6);
  local_22ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[6].tc_shader_body.field_2._M_local_buf + 8),"",&local_22c7);
  local_22c9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[6].te_shader_body.field_2._M_local_buf + 8),"",&local_22c8);
  local_22c9 = 0;
  local_22ca = 0;
  local_22cb = 0;
  local_22cc = 0;
  local_22cd = 0;
  local_2280 = (undefined1 *)((long)&test_cases[6].vs_shader_body.field_2 + 8);
  test_cases[6].vs_shader_body.field_2._8_4_ = 2;
  test_cases[6].vs_shader_body.field_2._12_4_ = 0x15;
  test_cases[7].src_array_size = 0x10;
  test_cases[7].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[7].dst_type,"",&local_22ce);
  local_22d8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[7].cs_shader_body.field_2._M_local_buf + 8),"",&local_22cf);
  local_22d7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[7].fs_shader_body.field_2._M_local_buf + 8),"",&local_22d0);
  local_22d6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[7].gs_shader_body.field_2._M_local_buf + 8),"",&local_22d1);
  local_22d5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[7].tc_shader_body.field_2._M_local_buf + 8),"",&local_22d2);
  local_22d4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[7].te_shader_body.field_2._M_local_buf + 8),"",&local_22d3);
  local_22d4 = 0;
  local_22d5 = 0;
  local_22d6 = 0;
  local_22d7 = 0;
  local_22d8 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[7].vs_shader_body.field_2 + 8);
  test_cases[7].vs_shader_body.field_2._8_4_ = 2;
  test_cases[7].vs_shader_body.field_2._12_4_ = 0x1f;
  test_cases[8].src_array_size = 4;
  test_cases[8].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[8].dst_type,"",&local_22d9);
  local_22e3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[8].cs_shader_body.field_2._M_local_buf + 8),"",&local_22da);
  local_22e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[8].fs_shader_body.field_2._M_local_buf + 8),"",&local_22db);
  local_22e1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[8].gs_shader_body.field_2._M_local_buf + 8),"",&local_22dc);
  local_22e0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[8].tc_shader_body.field_2._M_local_buf + 8),"",&local_22dd);
  local_22df = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[8].te_shader_body.field_2._M_local_buf + 8),"",&local_22de);
  local_22df = 0;
  local_22e0 = 0;
  local_22e1 = 0;
  local_22e2 = 0;
  local_22e3 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[8].vs_shader_body.field_2 + 8);
  test_cases[8].vs_shader_body.field_2._8_4_ = 2;
  test_cases[8].vs_shader_body.field_2._12_4_ = 0x1f;
  test_cases[9].src_array_size = 4;
  test_cases[9].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[9].dst_type,"",&local_22e4);
  local_22ee = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[9].cs_shader_body.field_2._M_local_buf + 8),"",&local_22e5);
  local_22ed = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[9].fs_shader_body.field_2._M_local_buf + 8),"",&local_22e6);
  local_22ec = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[9].gs_shader_body.field_2._M_local_buf + 8),"",&local_22e7);
  local_22eb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[9].tc_shader_body.field_2._M_local_buf + 8),"",&local_22e8);
  local_22ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[9].te_shader_body.field_2._M_local_buf + 8),"",&local_22e9);
  local_22ea = 0;
  local_22eb = 0;
  local_22ec = 0;
  local_22ed = 0;
  local_22ee = 0;
  local_2280 = (undefined1 *)((long)&test_cases[9].vs_shader_body.field_2 + 8);
  test_cases[9].vs_shader_body.field_2._8_4_ = 2;
  test_cases[9].vs_shader_body.field_2._12_4_ = 0x20;
  test_cases[10].src_array_size = 0xe;
  test_cases[10].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[10].dst_type,"",&local_22ef);
  local_22f9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[10].cs_shader_body.field_2._M_local_buf + 8),"",&local_22f0);
  local_22f8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[10].fs_shader_body.field_2._M_local_buf + 8),"",&local_22f1);
  local_22f7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[10].gs_shader_body.field_2._M_local_buf + 8),"",&local_22f2);
  local_22f6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[10].tc_shader_body.field_2._M_local_buf + 8),"",&local_22f3);
  local_22f5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[10].te_shader_body.field_2._M_local_buf + 8),"",&local_22f4);
  local_22f5 = 0;
  local_22f6 = 0;
  local_22f7 = 0;
  local_22f8 = 0;
  local_22f9 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[10].vs_shader_body.field_2 + 8);
  test_cases[10].vs_shader_body.field_2._8_4_ = 2;
  test_cases[10].vs_shader_body.field_2._12_4_ = 0x20;
  test_cases[0xb].src_array_size = 0xe;
  test_cases[0xb].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xb].dst_type,"",&local_22fa);
  local_2304 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xb].cs_shader_body.field_2._M_local_buf + 8),"",&local_22fb);
  local_2303 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xb].fs_shader_body.field_2._M_local_buf + 8),"",&local_22fc);
  local_2302 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xb].gs_shader_body.field_2._M_local_buf + 8),"",&local_22fd);
  local_2301 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xb].tc_shader_body.field_2._M_local_buf + 8),"",&local_22fe);
  local_2300 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xb].te_shader_body.field_2._M_local_buf + 8),"",&local_22ff);
  local_2300 = 0;
  local_2301 = 0;
  local_2302 = 0;
  local_2303 = 0;
  local_2304 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0xb].vs_shader_body.field_2 + 8);
  test_cases[0xb].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0xb].vs_shader_body.field_2._12_4_ = 0x21;
  test_cases[0xc].src_array_size = 0xf;
  test_cases[0xc].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xc].dst_type,"",&local_2305);
  local_230f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xc].cs_shader_body.field_2._M_local_buf + 8),"",&local_2306);
  local_230e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xc].fs_shader_body.field_2._M_local_buf + 8),"",&local_2307);
  local_230d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xc].gs_shader_body.field_2._M_local_buf + 8),"",&local_2308);
  local_230c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xc].tc_shader_body.field_2._M_local_buf + 8),"",&local_2309);
  local_230b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xc].te_shader_body.field_2._M_local_buf + 8),"",&local_230a);
  local_230b = 0;
  local_230c = 0;
  local_230d = 0;
  local_230e = 0;
  local_230f = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0xc].vs_shader_body.field_2 + 8);
  test_cases[0xc].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0xc].vs_shader_body.field_2._12_4_ = 0x21;
  test_cases[0xd].src_array_size = 0xf;
  test_cases[0xd].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xd].dst_type,"",&local_2310);
  local_231a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xd].cs_shader_body.field_2._M_local_buf + 8),"",&local_2311);
  local_2319 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xd].fs_shader_body.field_2._M_local_buf + 8),"",&local_2312);
  local_2318 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xd].gs_shader_body.field_2._M_local_buf + 8),"",&local_2313);
  local_2317 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xd].tc_shader_body.field_2._M_local_buf + 8),"",&local_2314);
  local_2316 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xd].te_shader_body.field_2._M_local_buf + 8),"",&local_2315);
  local_2316 = 0;
  local_2317 = 0;
  local_2318 = 0;
  local_2319 = 0;
  local_231a = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0xd].vs_shader_body.field_2 + 8);
  test_cases[0xd].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0xd].vs_shader_body.field_2._12_4_ = 0x22;
  test_cases[0xe].src_array_size = 0x10;
  test_cases[0xe].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xe].dst_type,"",&local_231b);
  local_2325 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xe].cs_shader_body.field_2._M_local_buf + 8),"",&local_231c);
  local_2324 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xe].fs_shader_body.field_2._M_local_buf + 8),"",&local_231d);
  local_2323 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xe].gs_shader_body.field_2._M_local_buf + 8),"",&local_231e);
  local_2322 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xe].tc_shader_body.field_2._M_local_buf + 8),"",&local_231f);
  local_2321 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xe].te_shader_body.field_2._M_local_buf + 8),"",&local_2320);
  local_2321 = 0;
  local_2322 = 0;
  local_2323 = 0;
  local_2324 = 0;
  local_2325 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0xe].vs_shader_body.field_2 + 8);
  test_cases[0xe].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0xe].vs_shader_body.field_2._12_4_ = 0x22;
  test_cases[0xf].src_array_size = 0x10;
  test_cases[0xf].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0xf].dst_type,"",&local_2326);
  local_2330 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xf].cs_shader_body.field_2._M_local_buf + 8),"",&local_2327);
  local_232f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xf].fs_shader_body.field_2._M_local_buf + 8),"",&local_2328);
  local_232e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xf].gs_shader_body.field_2._M_local_buf + 8),"",&local_2329);
  local_232d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xf].tc_shader_body.field_2._M_local_buf + 8),"",&local_232a);
  local_232c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0xf].te_shader_body.field_2._M_local_buf + 8),"",&local_232b);
  local_232c = 0;
  local_232d = 0;
  local_232e = 0;
  local_232f = 0;
  local_2330 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0xf].vs_shader_body.field_2 + 8);
  test_cases[0xf].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0xf].vs_shader_body.field_2._12_4_ = 0x11;
  test_cases[0x10].src_array_size = 4;
  test_cases[0x10].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x10].dst_type,"",&local_2331);
  local_233b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x10].cs_shader_body.field_2._M_local_buf + 8),"",&local_2332);
  local_233a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x10].fs_shader_body.field_2._M_local_buf + 8),"",&local_2333);
  local_2339 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x10].gs_shader_body.field_2._M_local_buf + 8),"",&local_2334);
  local_2338 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x10].tc_shader_body.field_2._M_local_buf + 8),"",&local_2335);
  local_2337 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x10].te_shader_body.field_2._M_local_buf + 8),"",&local_2336);
  local_2337 = 0;
  local_2338 = 0;
  local_2339 = 0;
  local_233a = 0;
  local_233b = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x10].vs_shader_body.field_2 + 8);
  test_cases[0x10].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x10].vs_shader_body.field_2._12_4_ = 0x11;
  test_cases[0x11].src_array_size = 4;
  test_cases[0x11].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x11].dst_type,"",&local_233c);
  local_2346 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x11].cs_shader_body.field_2._M_local_buf + 8),"",&local_233d);
  local_2345 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x11].fs_shader_body.field_2._M_local_buf + 8),"",&local_233e);
  local_2344 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x11].gs_shader_body.field_2._M_local_buf + 8),"",&local_233f);
  local_2343 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x11].tc_shader_body.field_2._M_local_buf + 8),"",&local_2340);
  local_2342 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x11].te_shader_body.field_2._M_local_buf + 8),"",&local_2341);
  local_2342 = 0;
  local_2343 = 0;
  local_2344 = 0;
  local_2345 = 0;
  local_2346 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x11].vs_shader_body.field_2 + 8);
  test_cases[0x11].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x11].vs_shader_body.field_2._12_4_ = 0x23;
  test_cases[0x12].src_array_size = 0xe;
  test_cases[0x12].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x12].dst_type,"",&local_2347);
  local_2351 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x12].cs_shader_body.field_2._M_local_buf + 8),"",&local_2348);
  local_2350 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x12].fs_shader_body.field_2._M_local_buf + 8),"",&local_2349);
  local_234f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x12].gs_shader_body.field_2._M_local_buf + 8),"",&local_234a);
  local_234e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x12].tc_shader_body.field_2._M_local_buf + 8),"",&local_234b);
  local_234d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x12].te_shader_body.field_2._M_local_buf + 8),"",&local_234c);
  local_234d = 0;
  local_234e = 0;
  local_234f = 0;
  local_2350 = 0;
  local_2351 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x12].vs_shader_body.field_2 + 8);
  test_cases[0x12].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x12].vs_shader_body.field_2._12_4_ = 0x23;
  test_cases[0x13].src_array_size = 0xe;
  test_cases[0x13].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x13].dst_type,"",&local_2352);
  local_235c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x13].cs_shader_body.field_2._M_local_buf + 8),"",&local_2353);
  local_235b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x13].fs_shader_body.field_2._M_local_buf + 8),"",&local_2354);
  local_235a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x13].gs_shader_body.field_2._M_local_buf + 8),"",&local_2355);
  local_2359 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x13].tc_shader_body.field_2._M_local_buf + 8),"",&local_2356);
  local_2358 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x13].te_shader_body.field_2._M_local_buf + 8),"",&local_2357);
  local_2358 = 0;
  local_2359 = 0;
  local_235a = 0;
  local_235b = 0;
  local_235c = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x13].vs_shader_body.field_2 + 8);
  test_cases[0x13].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x13].vs_shader_body.field_2._12_4_ = 0x24;
  test_cases[0x14].src_array_size = 0xf;
  test_cases[0x14].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x14].dst_type,"",&local_235d);
  local_2367 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x14].cs_shader_body.field_2._M_local_buf + 8),"",&local_235e);
  local_2366 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x14].fs_shader_body.field_2._M_local_buf + 8),"",&local_235f);
  local_2365 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x14].gs_shader_body.field_2._M_local_buf + 8),"",&local_2360);
  local_2364 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x14].tc_shader_body.field_2._M_local_buf + 8),"",&local_2361);
  local_2363 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x14].te_shader_body.field_2._M_local_buf + 8),"",&local_2362);
  local_2363 = 0;
  local_2364 = 0;
  local_2365 = 0;
  local_2366 = 0;
  local_2367 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x14].vs_shader_body.field_2 + 8);
  test_cases[0x14].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x14].vs_shader_body.field_2._12_4_ = 0x24;
  test_cases[0x15].src_array_size = 0xf;
  test_cases[0x15].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x15].dst_type,"",&local_2368);
  local_2372 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x15].cs_shader_body.field_2._M_local_buf + 8),"",&local_2369);
  local_2371 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x15].fs_shader_body.field_2._M_local_buf + 8),"",&local_236a);
  local_2370 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x15].gs_shader_body.field_2._M_local_buf + 8),"",&local_236b);
  local_236f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x15].tc_shader_body.field_2._M_local_buf + 8),"",&local_236c);
  local_236e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x15].te_shader_body.field_2._M_local_buf + 8),"",&local_236d);
  local_236e = 0;
  local_236f = 0;
  local_2370 = 0;
  local_2371 = 0;
  local_2372 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x15].vs_shader_body.field_2 + 8);
  test_cases[0x15].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x15].vs_shader_body.field_2._12_4_ = 0x25;
  test_cases[0x16].src_array_size = 0x10;
  test_cases[0x16].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x16].dst_type,"",&local_2373);
  local_237d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x16].cs_shader_body.field_2._M_local_buf + 8),"",&local_2374);
  local_237c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x16].fs_shader_body.field_2._M_local_buf + 8),"",&local_2375);
  local_237b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x16].gs_shader_body.field_2._M_local_buf + 8),"",&local_2376);
  local_237a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x16].tc_shader_body.field_2._M_local_buf + 8),"",&local_2377);
  local_2379 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x16].te_shader_body.field_2._M_local_buf + 8),"",&local_2378);
  local_2379 = 0;
  local_237a = 0;
  local_237b = 0;
  local_237c = 0;
  local_237d = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x16].vs_shader_body.field_2 + 8);
  test_cases[0x16].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x16].vs_shader_body.field_2._12_4_ = 0x25;
  test_cases[0x17].src_array_size = 0x10;
  test_cases[0x17].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x17].dst_type,"",&local_237e);
  local_2388 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x17].cs_shader_body.field_2._M_local_buf + 8),"",&local_237f);
  local_2387 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x17].fs_shader_body.field_2._M_local_buf + 8),"",&local_2380);
  local_2386 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x17].gs_shader_body.field_2._M_local_buf + 8),"",&local_2381);
  local_2385 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x17].tc_shader_body.field_2._M_local_buf + 8),"",&local_2382);
  local_2384 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x17].te_shader_body.field_2._M_local_buf + 8),"",&local_2383);
  local_2384 = 0;
  local_2385 = 0;
  local_2386 = 0;
  local_2387 = 0;
  local_2388 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x17].vs_shader_body.field_2 + 8);
  test_cases[0x17].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x17].vs_shader_body.field_2._12_4_ = 0x16;
  test_cases[0x18].src_array_size = 5;
  test_cases[0x18].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x18].dst_type,"",&local_2389);
  local_2393 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x18].cs_shader_body.field_2._M_local_buf + 8),"",&local_238a);
  local_2392 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x18].fs_shader_body.field_2._M_local_buf + 8),"",&local_238b);
  local_2391 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x18].gs_shader_body.field_2._M_local_buf + 8),"",&local_238c);
  local_2390 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x18].tc_shader_body.field_2._M_local_buf + 8),"",&local_238d);
  local_238f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x18].te_shader_body.field_2._M_local_buf + 8),"",&local_238e);
  local_238f = 0;
  local_2390 = 0;
  local_2391 = 0;
  local_2392 = 0;
  local_2393 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x18].vs_shader_body.field_2 + 8);
  test_cases[0x18].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x18].vs_shader_body.field_2._12_4_ = 0x16;
  test_cases[0x19].src_array_size = 5;
  test_cases[0x19].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x19].dst_type,"",&local_2394);
  local_239e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x19].cs_shader_body.field_2._M_local_buf + 8),"",&local_2395);
  local_239d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x19].fs_shader_body.field_2._M_local_buf + 8),"",&local_2396);
  local_239c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x19].gs_shader_body.field_2._M_local_buf + 8),"",&local_2397);
  local_239b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x19].tc_shader_body.field_2._M_local_buf + 8),"",&local_2398);
  local_239a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x19].te_shader_body.field_2._M_local_buf + 8),"",&local_2399);
  local_239a = 0;
  local_239b = 0;
  local_239c = 0;
  local_239d = 0;
  local_239e = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x19].vs_shader_body.field_2 + 8);
  test_cases[0x19].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x19].vs_shader_body.field_2._12_4_ = 0x19;
  test_cases[0x1a].src_array_size = 8;
  test_cases[0x1a].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1a].dst_type,"",&local_239f);
  local_23a9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1a].cs_shader_body.field_2._M_local_buf + 8),"",&local_23a0);
  local_23a8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1a].fs_shader_body.field_2._M_local_buf + 8),"",&local_23a1);
  local_23a7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1a].gs_shader_body.field_2._M_local_buf + 8),"",&local_23a2);
  local_23a6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1a].tc_shader_body.field_2._M_local_buf + 8),"",&local_23a3);
  local_23a5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1a].te_shader_body.field_2._M_local_buf + 8),"",&local_23a4);
  local_23a5 = 0;
  local_23a6 = 0;
  local_23a7 = 0;
  local_23a8 = 0;
  local_23a9 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x1a].vs_shader_body.field_2 + 8);
  test_cases[0x1a].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x1a].vs_shader_body.field_2._12_4_ = 0x19;
  test_cases[0x1b].src_array_size = 8;
  test_cases[0x1b].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1b].dst_type,"",&local_23aa);
  local_23b4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1b].cs_shader_body.field_2._M_local_buf + 8),"",&local_23ab);
  local_23b3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1b].fs_shader_body.field_2._M_local_buf + 8),"",&local_23ac);
  local_23b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1b].gs_shader_body.field_2._M_local_buf + 8),"",&local_23ad);
  local_23b1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1b].tc_shader_body.field_2._M_local_buf + 8),"",&local_23ae);
  local_23b0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1b].te_shader_body.field_2._M_local_buf + 8),"",&local_23af);
  local_23b0 = 0;
  local_23b1 = 0;
  local_23b2 = 0;
  local_23b3 = 0;
  local_23b4 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x1b].vs_shader_body.field_2 + 8);
  test_cases[0x1b].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x1b].vs_shader_body.field_2._12_4_ = 0x1c;
  test_cases[0x1c].src_array_size = 0xb;
  test_cases[0x1c].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1c].dst_type,"",&local_23b5);
  local_23bf = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1c].cs_shader_body.field_2._M_local_buf + 8),"",&local_23b6);
  local_23be = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1c].fs_shader_body.field_2._M_local_buf + 8),"",&local_23b7);
  local_23bd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1c].gs_shader_body.field_2._M_local_buf + 8),"",&local_23b8);
  local_23bc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1c].tc_shader_body.field_2._M_local_buf + 8),"",&local_23b9);
  local_23bb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1c].te_shader_body.field_2._M_local_buf + 8),"",&local_23ba);
  local_23bb = 0;
  local_23bc = 0;
  local_23bd = 0;
  local_23be = 0;
  local_23bf = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x1c].vs_shader_body.field_2 + 8);
  test_cases[0x1c].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x1c].vs_shader_body.field_2._12_4_ = 0x1c;
  test_cases[0x1d].src_array_size = 0xb;
  test_cases[0x1d].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1d].dst_type,"",&local_23c0);
  local_23ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1d].cs_shader_body.field_2._M_local_buf + 8),"",&local_23c1);
  local_23c9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1d].fs_shader_body.field_2._M_local_buf + 8),"",&local_23c2);
  local_23c8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1d].gs_shader_body.field_2._M_local_buf + 8),"",&local_23c3);
  local_23c7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1d].tc_shader_body.field_2._M_local_buf + 8),"",&local_23c4);
  local_23c6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1d].te_shader_body.field_2._M_local_buf + 8),"",&local_23c5);
  local_23c6 = 0;
  local_23c7 = 0;
  local_23c8 = 0;
  local_23c9 = 0;
  local_23ca = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x1d].vs_shader_body.field_2 + 8);
  test_cases[0x1d].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x1d].vs_shader_body.field_2._12_4_ = 0x17;
  test_cases[0x1e].src_array_size = 6;
  test_cases[0x1e].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1e].dst_type,"",&local_23cb);
  local_23d5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1e].cs_shader_body.field_2._M_local_buf + 8),"",&local_23cc);
  local_23d4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1e].fs_shader_body.field_2._M_local_buf + 8),"",&local_23cd);
  local_23d3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1e].gs_shader_body.field_2._M_local_buf + 8),"",&local_23ce);
  local_23d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1e].tc_shader_body.field_2._M_local_buf + 8),"",&local_23cf);
  local_23d1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1e].te_shader_body.field_2._M_local_buf + 8),"",&local_23d0);
  local_23d1 = 0;
  local_23d2 = 0;
  local_23d3 = 0;
  local_23d4 = 0;
  local_23d5 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x1e].vs_shader_body.field_2 + 8);
  test_cases[0x1e].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x1e].vs_shader_body.field_2._12_4_ = 0x17;
  test_cases[0x1f].src_array_size = 6;
  test_cases[0x1f].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x1f].dst_type,"",&local_23d6);
  local_23e0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1f].cs_shader_body.field_2._M_local_buf + 8),"",&local_23d7);
  local_23df = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1f].fs_shader_body.field_2._M_local_buf + 8),"",&local_23d8);
  local_23de = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1f].gs_shader_body.field_2._M_local_buf + 8),"",&local_23d9);
  local_23dd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1f].tc_shader_body.field_2._M_local_buf + 8),"",&local_23da);
  local_23dc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x1f].te_shader_body.field_2._M_local_buf + 8),"",&local_23db);
  local_23dc = 0;
  local_23dd = 0;
  local_23de = 0;
  local_23df = 0;
  local_23e0 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x1f].vs_shader_body.field_2 + 8);
  test_cases[0x1f].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x1f].vs_shader_body.field_2._12_4_ = 0x18;
  test_cases[0x20].src_array_size = 7;
  test_cases[0x20].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x20].dst_type,"",&local_23e1);
  local_23eb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x20].cs_shader_body.field_2._M_local_buf + 8),"",&local_23e2);
  local_23ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x20].fs_shader_body.field_2._M_local_buf + 8),"",&local_23e3);
  local_23e9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x20].gs_shader_body.field_2._M_local_buf + 8),"",&local_23e4);
  local_23e8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x20].tc_shader_body.field_2._M_local_buf + 8),"",&local_23e5);
  local_23e7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x20].te_shader_body.field_2._M_local_buf + 8),"",&local_23e6);
  local_23e7 = 0;
  local_23e8 = 0;
  local_23e9 = 0;
  local_23ea = 0;
  local_23eb = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x20].vs_shader_body.field_2 + 8);
  test_cases[0x20].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x20].vs_shader_body.field_2._12_4_ = 0x18;
  test_cases[0x21].src_array_size = 7;
  test_cases[0x21].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x21].dst_type,"",&local_23ec);
  local_23f6 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x21].cs_shader_body.field_2._M_local_buf + 8),"",&local_23ed);
  local_23f5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x21].fs_shader_body.field_2._M_local_buf + 8),"",&local_23ee);
  local_23f4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x21].gs_shader_body.field_2._M_local_buf + 8),"",&local_23ef);
  local_23f3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x21].tc_shader_body.field_2._M_local_buf + 8),"",&local_23f0);
  local_23f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x21].te_shader_body.field_2._M_local_buf + 8),"",&local_23f1);
  local_23f2 = 0;
  local_23f3 = 0;
  local_23f4 = 0;
  local_23f5 = 0;
  local_23f6 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x21].vs_shader_body.field_2 + 8);
  test_cases[0x21].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x21].vs_shader_body.field_2._12_4_ = 0x1a;
  test_cases[0x22].src_array_size = 9;
  test_cases[0x22].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x22].dst_type,"",&local_23f7);
  local_2401 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x22].cs_shader_body.field_2._M_local_buf + 8),"",&local_23f8);
  local_2400 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x22].fs_shader_body.field_2._M_local_buf + 8),"",&local_23f9);
  local_23ff = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x22].gs_shader_body.field_2._M_local_buf + 8),"",&local_23fa);
  local_23fe = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x22].tc_shader_body.field_2._M_local_buf + 8),"",&local_23fb);
  local_23fd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x22].te_shader_body.field_2._M_local_buf + 8),"",&local_23fc);
  local_23fd = 0;
  local_23fe = 0;
  local_23ff = 0;
  local_2400 = 0;
  local_2401 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x22].vs_shader_body.field_2 + 8);
  test_cases[0x22].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x22].vs_shader_body.field_2._12_4_ = 0x1a;
  test_cases[0x23].src_array_size = 9;
  test_cases[0x23].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x23].dst_type,"",&local_2402);
  local_240c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x23].cs_shader_body.field_2._M_local_buf + 8),"",&local_2403);
  local_240b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x23].fs_shader_body.field_2._M_local_buf + 8),"",&local_2404);
  local_240a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x23].gs_shader_body.field_2._M_local_buf + 8),"",&local_2405);
  local_2409 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x23].tc_shader_body.field_2._M_local_buf + 8),"",&local_2406);
  local_2408 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x23].te_shader_body.field_2._M_local_buf + 8),"",&local_2407);
  local_2408 = 0;
  local_2409 = 0;
  local_240a = 0;
  local_240b = 0;
  local_240c = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x23].vs_shader_body.field_2 + 8);
  test_cases[0x23].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x23].vs_shader_body.field_2._12_4_ = 0x1b;
  test_cases[0x24].src_array_size = 10;
  test_cases[0x24].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x24].dst_type,"",&local_240d);
  local_2417 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x24].cs_shader_body.field_2._M_local_buf + 8),"",&local_240e);
  local_2416 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x24].fs_shader_body.field_2._M_local_buf + 8),"",&local_240f);
  local_2415 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x24].gs_shader_body.field_2._M_local_buf + 8),"",&local_2410);
  local_2414 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x24].tc_shader_body.field_2._M_local_buf + 8),"",&local_2411);
  local_2413 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x24].te_shader_body.field_2._M_local_buf + 8),"",&local_2412);
  local_2413 = 0;
  local_2414 = 0;
  local_2415 = 0;
  local_2416 = 0;
  local_2417 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x24].vs_shader_body.field_2 + 8);
  test_cases[0x24].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x24].vs_shader_body.field_2._12_4_ = 0x1b;
  test_cases[0x25].src_array_size = 10;
  test_cases[0x25].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x25].dst_type,"",&local_2418);
  local_2422 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x25].cs_shader_body.field_2._M_local_buf + 8),"",&local_2419);
  local_2421 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x25].fs_shader_body.field_2._M_local_buf + 8),"",&local_241a);
  local_2420 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x25].gs_shader_body.field_2._M_local_buf + 8),"",&local_241b);
  local_241f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x25].tc_shader_body.field_2._M_local_buf + 8),"",&local_241c);
  local_241e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x25].te_shader_body.field_2._M_local_buf + 8),"",&local_241d);
  local_241e = 0;
  local_241f = 0;
  local_2420 = 0;
  local_2421 = 0;
  local_2422 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x25].vs_shader_body.field_2 + 8);
  test_cases[0x25].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x25].vs_shader_body.field_2._12_4_ = 0x1d;
  test_cases[0x26].src_array_size = 0xc;
  test_cases[0x26].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x26].dst_type,"",&local_2423);
  local_242d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x26].cs_shader_body.field_2._M_local_buf + 8),"",&local_2424);
  local_242c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x26].fs_shader_body.field_2._M_local_buf + 8),"",&local_2425);
  local_242b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x26].gs_shader_body.field_2._M_local_buf + 8),"",&local_2426);
  local_242a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x26].tc_shader_body.field_2._M_local_buf + 8),"",&local_2427);
  local_2429 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x26].te_shader_body.field_2._M_local_buf + 8),"",&local_2428);
  local_2429 = 0;
  local_242a = 0;
  local_242b = 0;
  local_242c = 0;
  local_242d = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x26].vs_shader_body.field_2 + 8);
  test_cases[0x26].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x26].vs_shader_body.field_2._12_4_ = 0x1d;
  test_cases[0x27].src_array_size = 0xc;
  test_cases[0x27].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x27].dst_type,"",&local_242e);
  local_2438 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x27].cs_shader_body.field_2._M_local_buf + 8),"",&local_242f);
  local_2437 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x27].fs_shader_body.field_2._M_local_buf + 8),"",&local_2430);
  local_2436 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x27].gs_shader_body.field_2._M_local_buf + 8),"",&local_2431);
  local_2435 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x27].tc_shader_body.field_2._M_local_buf + 8),"",&local_2432);
  local_2434 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x27].te_shader_body.field_2._M_local_buf + 8),"",&local_2433);
  local_2434 = 0;
  local_2435 = 0;
  local_2436 = 0;
  local_2437 = 0;
  local_2438 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x27].vs_shader_body.field_2 + 8);
  test_cases[0x27].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x27].vs_shader_body.field_2._12_4_ = 0x1e;
  test_cases[0x28].src_array_size = 0xd;
  test_cases[0x28].src_type._0_1_ = VARIABLE_TYPE_BOOL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x28].dst_type,"",&local_2439);
  local_2443 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x28].cs_shader_body.field_2._M_local_buf + 8),"",&local_243a);
  local_2442 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x28].fs_shader_body.field_2._M_local_buf + 8),"",&local_243b);
  local_2441 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x28].gs_shader_body.field_2._M_local_buf + 8),"",&local_243c);
  local_2440 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x28].tc_shader_body.field_2._M_local_buf + 8),"",&local_243d);
  local_243f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x28].te_shader_body.field_2._M_local_buf + 8),"",&local_243e);
  local_243f = 0;
  local_2440 = 0;
  local_2441 = 0;
  local_2442 = 0;
  local_2443 = 0;
  local_2280 = (undefined1 *)((long)&test_cases[0x28].vs_shader_body.field_2 + 8);
  test_cases[0x28].vs_shader_body.field_2._8_4_ = 2;
  test_cases[0x28].vs_shader_body.field_2._12_4_ = 0x1e;
  test_cases[0x29].src_array_size = 0xd;
  test_cases[0x29].src_type._0_1_ = VARIABLE_TYPE_BVEC2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_cases[0x29].dst_type,"",&local_2444);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x29].cs_shader_body.field_2._M_local_buf + 8),"",&local_2445);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x29].fs_shader_body.field_2._M_local_buf + 8),"",&local_2446);
  n_test_cases._0_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x29].gs_shader_body.field_2._M_local_buf + 8),"",&local_2447);
  n_test_cases._1_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x29].tc_shader_body.field_2._M_local_buf + 8),"",&local_2448);
  n_test_cases._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(test_cases[0x29].te_shader_body.field_2._M_local_buf + 8),"",
             (allocator<char> *)((long)&n_test_cases + 3));
  n_test_cases._2_1_ = 0;
  n_test_cases._1_1_ = 0;
  n_test_cases._0_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_test_cases + 3));
  std::allocator<char>::~allocator(&local_2448);
  std::allocator<char>::~allocator(&local_2447);
  std::allocator<char>::~allocator(&local_2446);
  std::allocator<char>::~allocator(&local_2445);
  std::allocator<char>::~allocator(&local_2444);
  std::allocator<char>::~allocator(&local_243e);
  std::allocator<char>::~allocator(&local_243d);
  std::allocator<char>::~allocator(&local_243c);
  std::allocator<char>::~allocator(&local_243b);
  std::allocator<char>::~allocator(&local_243a);
  std::allocator<char>::~allocator(&local_2439);
  std::allocator<char>::~allocator(&local_2433);
  std::allocator<char>::~allocator(&local_2432);
  std::allocator<char>::~allocator(&local_2431);
  std::allocator<char>::~allocator(&local_2430);
  std::allocator<char>::~allocator(&local_242f);
  std::allocator<char>::~allocator(&local_242e);
  std::allocator<char>::~allocator(&local_2428);
  std::allocator<char>::~allocator(&local_2427);
  std::allocator<char>::~allocator(&local_2426);
  std::allocator<char>::~allocator(&local_2425);
  std::allocator<char>::~allocator(&local_2424);
  std::allocator<char>::~allocator(&local_2423);
  std::allocator<char>::~allocator(&local_241d);
  std::allocator<char>::~allocator(&local_241c);
  std::allocator<char>::~allocator(&local_241b);
  std::allocator<char>::~allocator(&local_241a);
  std::allocator<char>::~allocator(&local_2419);
  std::allocator<char>::~allocator(&local_2418);
  std::allocator<char>::~allocator(&local_2412);
  std::allocator<char>::~allocator(&local_2411);
  std::allocator<char>::~allocator(&local_2410);
  std::allocator<char>::~allocator(&local_240f);
  std::allocator<char>::~allocator(&local_240e);
  std::allocator<char>::~allocator(&local_240d);
  std::allocator<char>::~allocator(&local_2407);
  std::allocator<char>::~allocator(&local_2406);
  std::allocator<char>::~allocator(&local_2405);
  std::allocator<char>::~allocator(&local_2404);
  std::allocator<char>::~allocator(&local_2403);
  std::allocator<char>::~allocator(&local_2402);
  std::allocator<char>::~allocator(&local_23fc);
  std::allocator<char>::~allocator(&local_23fb);
  std::allocator<char>::~allocator(&local_23fa);
  std::allocator<char>::~allocator(&local_23f9);
  std::allocator<char>::~allocator(&local_23f8);
  std::allocator<char>::~allocator(&local_23f7);
  std::allocator<char>::~allocator(&local_23f1);
  std::allocator<char>::~allocator(&local_23f0);
  std::allocator<char>::~allocator(&local_23ef);
  std::allocator<char>::~allocator(&local_23ee);
  std::allocator<char>::~allocator(&local_23ed);
  std::allocator<char>::~allocator(&local_23ec);
  std::allocator<char>::~allocator(&local_23e6);
  std::allocator<char>::~allocator(&local_23e5);
  std::allocator<char>::~allocator(&local_23e4);
  std::allocator<char>::~allocator(&local_23e3);
  std::allocator<char>::~allocator(&local_23e2);
  std::allocator<char>::~allocator(&local_23e1);
  std::allocator<char>::~allocator(&local_23db);
  std::allocator<char>::~allocator(&local_23da);
  std::allocator<char>::~allocator(&local_23d9);
  std::allocator<char>::~allocator(&local_23d8);
  std::allocator<char>::~allocator(&local_23d7);
  std::allocator<char>::~allocator(&local_23d6);
  std::allocator<char>::~allocator(&local_23d0);
  std::allocator<char>::~allocator(&local_23cf);
  std::allocator<char>::~allocator(&local_23ce);
  std::allocator<char>::~allocator(&local_23cd);
  std::allocator<char>::~allocator(&local_23cc);
  std::allocator<char>::~allocator(&local_23cb);
  std::allocator<char>::~allocator(&local_23c5);
  std::allocator<char>::~allocator(&local_23c4);
  std::allocator<char>::~allocator(&local_23c3);
  std::allocator<char>::~allocator(&local_23c2);
  std::allocator<char>::~allocator(&local_23c1);
  std::allocator<char>::~allocator(&local_23c0);
  std::allocator<char>::~allocator(&local_23ba);
  std::allocator<char>::~allocator(&local_23b9);
  std::allocator<char>::~allocator(&local_23b8);
  std::allocator<char>::~allocator(&local_23b7);
  std::allocator<char>::~allocator(&local_23b6);
  std::allocator<char>::~allocator(&local_23b5);
  std::allocator<char>::~allocator(&local_23af);
  std::allocator<char>::~allocator(&local_23ae);
  std::allocator<char>::~allocator(&local_23ad);
  std::allocator<char>::~allocator(&local_23ac);
  std::allocator<char>::~allocator(&local_23ab);
  std::allocator<char>::~allocator(&local_23aa);
  std::allocator<char>::~allocator(&local_23a4);
  std::allocator<char>::~allocator(&local_23a3);
  std::allocator<char>::~allocator(&local_23a2);
  std::allocator<char>::~allocator(&local_23a1);
  std::allocator<char>::~allocator(&local_23a0);
  std::allocator<char>::~allocator(&local_239f);
  std::allocator<char>::~allocator(&local_2399);
  std::allocator<char>::~allocator(&local_2398);
  std::allocator<char>::~allocator(&local_2397);
  std::allocator<char>::~allocator(&local_2396);
  std::allocator<char>::~allocator(&local_2395);
  std::allocator<char>::~allocator(&local_2394);
  std::allocator<char>::~allocator(&local_238e);
  std::allocator<char>::~allocator(&local_238d);
  std::allocator<char>::~allocator(&local_238c);
  std::allocator<char>::~allocator(&local_238b);
  std::allocator<char>::~allocator(&local_238a);
  std::allocator<char>::~allocator(&local_2389);
  std::allocator<char>::~allocator(&local_2383);
  std::allocator<char>::~allocator(&local_2382);
  std::allocator<char>::~allocator(&local_2381);
  std::allocator<char>::~allocator(&local_2380);
  std::allocator<char>::~allocator(&local_237f);
  std::allocator<char>::~allocator(&local_237e);
  std::allocator<char>::~allocator(&local_2378);
  std::allocator<char>::~allocator(&local_2377);
  std::allocator<char>::~allocator(&local_2376);
  std::allocator<char>::~allocator(&local_2375);
  std::allocator<char>::~allocator(&local_2374);
  std::allocator<char>::~allocator(&local_2373);
  std::allocator<char>::~allocator(&local_236d);
  std::allocator<char>::~allocator(&local_236c);
  std::allocator<char>::~allocator(&local_236b);
  std::allocator<char>::~allocator(&local_236a);
  std::allocator<char>::~allocator(&local_2369);
  std::allocator<char>::~allocator(&local_2368);
  std::allocator<char>::~allocator(&local_2362);
  std::allocator<char>::~allocator(&local_2361);
  std::allocator<char>::~allocator(&local_2360);
  std::allocator<char>::~allocator(&local_235f);
  std::allocator<char>::~allocator(&local_235e);
  std::allocator<char>::~allocator(&local_235d);
  std::allocator<char>::~allocator(&local_2357);
  std::allocator<char>::~allocator(&local_2356);
  std::allocator<char>::~allocator(&local_2355);
  std::allocator<char>::~allocator(&local_2354);
  std::allocator<char>::~allocator(&local_2353);
  std::allocator<char>::~allocator(&local_2352);
  std::allocator<char>::~allocator(&local_234c);
  std::allocator<char>::~allocator(&local_234b);
  std::allocator<char>::~allocator(&local_234a);
  std::allocator<char>::~allocator(&local_2349);
  std::allocator<char>::~allocator(&local_2348);
  std::allocator<char>::~allocator(&local_2347);
  std::allocator<char>::~allocator(&local_2341);
  std::allocator<char>::~allocator(&local_2340);
  std::allocator<char>::~allocator(&local_233f);
  std::allocator<char>::~allocator(&local_233e);
  std::allocator<char>::~allocator(&local_233d);
  std::allocator<char>::~allocator(&local_233c);
  std::allocator<char>::~allocator(&local_2336);
  std::allocator<char>::~allocator(&local_2335);
  std::allocator<char>::~allocator(&local_2334);
  std::allocator<char>::~allocator(&local_2333);
  std::allocator<char>::~allocator(&local_2332);
  std::allocator<char>::~allocator(&local_2331);
  std::allocator<char>::~allocator(&local_232b);
  std::allocator<char>::~allocator(&local_232a);
  std::allocator<char>::~allocator(&local_2329);
  std::allocator<char>::~allocator(&local_2328);
  std::allocator<char>::~allocator(&local_2327);
  std::allocator<char>::~allocator(&local_2326);
  std::allocator<char>::~allocator(&local_2320);
  std::allocator<char>::~allocator(&local_231f);
  std::allocator<char>::~allocator(&local_231e);
  std::allocator<char>::~allocator(&local_231d);
  std::allocator<char>::~allocator(&local_231c);
  std::allocator<char>::~allocator(&local_231b);
  std::allocator<char>::~allocator(&local_2315);
  std::allocator<char>::~allocator(&local_2314);
  std::allocator<char>::~allocator(&local_2313);
  std::allocator<char>::~allocator(&local_2312);
  std::allocator<char>::~allocator(&local_2311);
  std::allocator<char>::~allocator(&local_2310);
  std::allocator<char>::~allocator(&local_230a);
  std::allocator<char>::~allocator(&local_2309);
  std::allocator<char>::~allocator(&local_2308);
  std::allocator<char>::~allocator(&local_2307);
  std::allocator<char>::~allocator(&local_2306);
  std::allocator<char>::~allocator(&local_2305);
  std::allocator<char>::~allocator(&local_22ff);
  std::allocator<char>::~allocator(&local_22fe);
  std::allocator<char>::~allocator(&local_22fd);
  std::allocator<char>::~allocator(&local_22fc);
  std::allocator<char>::~allocator(&local_22fb);
  std::allocator<char>::~allocator(&local_22fa);
  std::allocator<char>::~allocator(&local_22f4);
  std::allocator<char>::~allocator(&local_22f3);
  std::allocator<char>::~allocator(&local_22f2);
  std::allocator<char>::~allocator(&local_22f1);
  std::allocator<char>::~allocator(&local_22f0);
  std::allocator<char>::~allocator(&local_22ef);
  std::allocator<char>::~allocator(&local_22e9);
  std::allocator<char>::~allocator(&local_22e8);
  std::allocator<char>::~allocator(&local_22e7);
  std::allocator<char>::~allocator(&local_22e6);
  std::allocator<char>::~allocator(&local_22e5);
  std::allocator<char>::~allocator(&local_22e4);
  std::allocator<char>::~allocator(&local_22de);
  std::allocator<char>::~allocator(&local_22dd);
  std::allocator<char>::~allocator(&local_22dc);
  std::allocator<char>::~allocator(&local_22db);
  std::allocator<char>::~allocator(&local_22da);
  std::allocator<char>::~allocator(&local_22d9);
  std::allocator<char>::~allocator(&local_22d3);
  std::allocator<char>::~allocator(&local_22d2);
  std::allocator<char>::~allocator(&local_22d1);
  std::allocator<char>::~allocator(&local_22d0);
  std::allocator<char>::~allocator(&local_22cf);
  std::allocator<char>::~allocator(&local_22ce);
  std::allocator<char>::~allocator(&local_22c8);
  std::allocator<char>::~allocator(&local_22c7);
  std::allocator<char>::~allocator(&local_22c6);
  std::allocator<char>::~allocator(&local_22c5);
  std::allocator<char>::~allocator(&local_22c4);
  std::allocator<char>::~allocator(&local_22c3);
  std::allocator<char>::~allocator(&local_22bd);
  std::allocator<char>::~allocator(&local_22bc);
  std::allocator<char>::~allocator(&local_22bb);
  std::allocator<char>::~allocator(&local_22ba);
  std::allocator<char>::~allocator(&local_22b9);
  std::allocator<char>::~allocator(&local_22b8);
  std::allocator<char>::~allocator(&local_22b2);
  std::allocator<char>::~allocator(&local_22b1);
  std::allocator<char>::~allocator(&local_22b0);
  std::allocator<char>::~allocator(&local_22af);
  std::allocator<char>::~allocator(&local_22ae);
  std::allocator<char>::~allocator(&local_22ad);
  std::allocator<char>::~allocator(&local_22a7);
  std::allocator<char>::~allocator(&local_22a6);
  std::allocator<char>::~allocator(&local_22a5);
  std::allocator<char>::~allocator(&local_22a4);
  std::allocator<char>::~allocator(&local_22a3);
  std::allocator<char>::~allocator(&local_22a2);
  std::allocator<char>::~allocator(&local_229c);
  std::allocator<char>::~allocator(&local_229b);
  std::allocator<char>::~allocator(&local_229a);
  std::allocator<char>::~allocator(&local_2299);
  std::allocator<char>::~allocator(&local_2298);
  std::allocator<char>::~allocator(&local_2297);
  std::allocator<char>::~allocator(&local_2291);
  std::allocator<char>::~allocator(&local_2290);
  std::allocator<char>::~allocator(&local_228f);
  std::allocator<char>::~allocator(&local_228e);
  std::allocator<char>::~allocator(&local_228d);
  std::allocator<char>::~allocator(&local_228c);
  std::allocator<char>::~allocator(&local_2286);
  std::allocator<char>::~allocator(&local_2285);
  std::allocator<char>::~allocator(&local_2284);
  std::allocator<char>::~allocator(&local_2283);
  std::allocator<char>::~allocator(&local_2282);
  std::allocator<char>::~allocator(&local_2281);
  for (test_case._0_4_ = 0; (uint)test_case < 0x2a; test_case._0_4_ = (uint)test_case + 1) {
    initIteration(this,(_test_case *)(local_2278 + (ulong)(uint)test_case * 0xd0));
    bVar1 = executeIteration(this,(_test_case *)(local_2278 + (ulong)(uint)test_case * 0xd0));
    this->m_has_test_passed = (this->m_has_test_passed & 1U & bVar1) != 0;
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  this_local._4_4_ = STOP;
  local_35b0 = (_test_case *)((long)&test_cases[0x29].vs_shader_body.field_2 + 8);
  do {
    local_35b0 = local_35b0 + -1;
    _test_case::~_test_case(local_35b0);
  } while (local_35b0 != (_test_case *)local_2278);
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test6::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize GL objects needed to run the tests */
	initTest();

	/* Build iteration array to run the tests in an automated manner */
	_test_case test_cases[] = {
		/* Src array size */ /* Src type */ /* Dst type */ /* wrap_dst_type_in_structure */
		{ 2, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_INT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_IVEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UINT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_UVEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_FLOAT, Utils::VARIABLE_TYPE_DOUBLE, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC2, Utils::VARIABLE_TYPE_DVEC2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC3, Utils::VARIABLE_TYPE_DVEC3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_VEC4, Utils::VARIABLE_TYPE_DVEC4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2, Utils::VARIABLE_TYPE_DMAT2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3, Utils::VARIABLE_TYPE_DMAT3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4, Utils::VARIABLE_TYPE_DMAT4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X3, Utils::VARIABLE_TYPE_DMAT2X3, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT2X4, Utils::VARIABLE_TYPE_DMAT2X4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X2, Utils::VARIABLE_TYPE_DMAT3X2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT3X4, Utils::VARIABLE_TYPE_DMAT3X4, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X2, Utils::VARIABLE_TYPE_DMAT4X2, true, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, false, "", "", "", "", "", "" },
		{ 2, Utils::VARIABLE_TYPE_MAT4X3, Utils::VARIABLE_TYPE_DMAT4X3, true, "", "", "", "", "", "" }
	};
	const unsigned int n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Execute all iterations */
	for (unsigned int n_test_case = 0; n_test_case < n_test_cases; ++n_test_case)
	{
		_test_case& test_case = test_cases[n_test_case];

		/* Initialize a program object we will use to perform the casting */
		initIteration(test_case);

		/* Use the program object to XFB the results */
		m_has_test_passed &= executeIteration(test_case);

	} /* for (all test cases) */

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}